

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O2

void __thiscall embree::Statistics::add(Statistics *this,float a)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  float fVar4;
  
  dVar2 = this->v + (double)a;
  dVar3 = this->v2 + (double)(a * a);
  auVar1._8_4_ = SUB84(dVar3,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
  this->v = dVar2;
  this->v2 = (double)auVar1._8_8_;
  fVar4 = this->vmin;
  if (a <= this->vmin) {
    fVar4 = a;
  }
  this->vmin = fVar4;
  if (a <= this->vmax) {
    a = this->vmax;
  }
  this->vmax = a;
  this->N = this->N + 1;
  return;
}

Assistant:

void add(float a) 
    {
      v += a;
      v2 += a*a;
      vmin = min(vmin,a);
      vmax = max(vmax,a);
      N++;
    }